

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O0

void __thiscall vector_brodnik<unsigned_char_*>::grow(vector_brodnik<unsigned_char_*> *this)

{
  uchar **ppuVar1;
  vector_brodnik<unsigned_char_*> *this_local;
  
  if (this->_left_in_block == 0) {
    if (this->_left_in_superblock == 0) {
      if ((this->_superblock & 1) == 0) {
        this->_block_size = this->_block_size << 1;
      }
      else {
        this->_superblock_size = this->_superblock_size << 1;
      }
      this->_superblock = this->_superblock + '\x01';
      this->_left_in_superblock = this->_superblock_size;
    }
    ppuVar1 = (uchar **)malloc(this->_block_size << 3);
    this->_insertpos = ppuVar1;
    std::vector<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
              (&this->_index_block,&this->_insertpos);
    this->_left_in_block = this->_block_size;
    this->_left_in_superblock = this->_left_in_superblock - 1;
    return;
  }
  __assert_fail("_left_in_block == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_brodnik.h"
                ,0x56,"void vector_brodnik<unsigned char *>::grow() [T = unsigned char *]");
}

Assistant:

void grow()
	{
		assert(_left_in_block == 0);
		if (_left_in_superblock == 0) {
			if (_superblock&1) { _superblock_size *= 2; }
			else               { _block_size *= 2;      }
			++_superblock;
			_left_in_superblock = _superblock_size;
		}
		_insertpos = static_cast<T*>(malloc(_block_size*sizeof(T)));
		_index_block.push_back(_insertpos);
		_left_in_block = _block_size;
		--_left_in_superblock;
	}